

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEObservation.h
# Opt level: O0

double __thiscall CEObservation::GetAzimuth_Rad(CEObservation *this)

{
  double dVar1;
  CEDate *jd;
  CESkyCoord *in_stack_ffffffffffffff98;
  CEDate *in_stack_ffffffffffffffa0;
  CEObservation *in_stack_ffffffffffffffc0;
  CEAngle local_18;
  
  UpdateCoordinates(in_stack_ffffffffffffffc0);
  CppEphem::julian_date_J2000();
  jd = (CEDate *)&stack0xffffffffffffffa8;
  CEDate::CEDate(in_stack_ffffffffffffffa0,(double)in_stack_ffffffffffffff98,
                 (CEDateType)((ulong)jd >> 0x20));
  CESkyCoord::XCoord(in_stack_ffffffffffffff98,jd);
  dVar1 = CEAngle::Rad(&local_18);
  CEAngle::~CEAngle((CEAngle *)0x15b286);
  CEDate::~CEDate((CEDate *)0x15b290);
  return dVar1;
}

Assistant:

inline
double CEObservation::GetAzimuth_Rad()
{
    UpdateCoordinates();
    return cached_coords_.XCoord().Rad();
}